

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXMaterial.cpp
# Opt level: O2

void __thiscall Assimp::FBX::Material::~Material(Material *this)

{
  (this->super_Object)._vptr_Object = (_func_int **)&PTR__Material_00821940;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::LayeredTexture_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::LayeredTexture_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::LayeredTexture_*>_>_>
  ::~_Rb_tree(&(this->layeredTextures)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::Texture_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::Texture_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::Texture_*>_>_>
  ::~_Rb_tree(&(this->textures)._M_t);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->props).
              super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)&this->shading);
  Object::~Object(&this->super_Object);
  return;
}

Assistant:

Material::~Material()
{
}